

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O0

void duckdb::UnaryExecutor::
     ExecuteLoop<long,duckdb::hugeint_t,duckdb::GenericUnaryWrapper,duckdb::DecimalScaleDownCheckOperator>
               (long *ldata,hugeint_t *result_data,idx_t count,SelectionVector *sel_vector,
               ValidityMask *mask,ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  bool bVar1;
  uint64_t *puVar2;
  ValidityMask *mask_00;
  SelectionVector *in_RCX;
  ulong in_RDX;
  long in_RSI;
  TemplatedValidityMask<unsigned_long> *in_R8;
  idx_t idx_1;
  idx_t i_1;
  idx_t idx;
  idx_t i;
  hugeint_t in_stack_ffffffffffffff88;
  ValidityMask *in_stack_ffffffffffffff98;
  long in_stack_ffffffffffffffa0;
  ulong idx_00;
  hugeint_t in_stack_ffffffffffffffa8;
  ulong local_40;
  
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_R8);
  if (bVar1) {
    for (idx_00 = 0; idx_00 < in_RDX; idx_00 = idx_00 + 1) {
      mask_00 = (ValidityMask *)SelectionVector::get_index(in_RCX,idx_00);
      in_stack_ffffffffffffff88 =
           GenericUnaryWrapper::
           Operation<duckdb::DecimalScaleDownCheckOperator,long,duckdb::hugeint_t>
                     (idx_00,mask_00,in_stack_ffffffffffffff88.upper,
                      (void *)in_stack_ffffffffffffff88.lower);
      puVar2 = (uint64_t *)(in_RSI + idx_00 * 0x10);
      *puVar2 = in_stack_ffffffffffffff88.lower;
      puVar2[1] = in_stack_ffffffffffffff88.upper;
    }
  }
  else {
    for (local_40 = 0; local_40 < in_RDX; local_40 = local_40 + 1) {
      SelectionVector::get_index(in_RCX,local_40);
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValidUnsafe
                        ((TemplatedValidityMask<unsigned_long> *)in_stack_ffffffffffffffa8.upper,
                         in_stack_ffffffffffffffa8.lower);
      if (bVar1) {
        in_stack_ffffffffffffffa8 =
             GenericUnaryWrapper::
             Operation<duckdb::DecimalScaleDownCheckOperator,long,duckdb::hugeint_t>
                       (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                        (idx_t)in_stack_ffffffffffffff88.upper,
                        (void *)in_stack_ffffffffffffff88.lower);
        puVar2 = (uint64_t *)(in_RSI + local_40 * 0x10);
        *puVar2 = in_stack_ffffffffffffffa8.lower;
        puVar2[1] = in_stack_ffffffffffffffa8.upper;
      }
      else {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  ((TemplatedValidityMask<unsigned_long> *)in_stack_ffffffffffffff88.upper,
                   (idx_t)in_stack_ffffffffffffff88.lower);
      }
    }
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector *__restrict sel_vector, ValidityMask &mask,
	                               ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
#ifdef DEBUG
		// ldata may point to a compressed dictionary buffer which can be smaller than ldata + count
		idx_t max_index = 0;
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector->get_index(i);
			max_index = MaxValue(max_index, idx);
		}
		ASSERT_RESTRICT(ldata, ldata + max_index, result_data, result_data + count);
#endif

		if (!mask.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				if (mask.RowIsValidUnsafe(idx)) {
					result_data[i] =
					    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
				} else {
					result_mask.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
			}
		}
	}